

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::Bone::AddChild(Bone *this,Bone *bone)

{
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (bone == (Bone *)0x0) {
    return;
  }
  if ((bone->parentId != -1) && (bone->parent != (Bone *)0x0)) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_38,"Attaching child Bone that is already parented: ",&bone->name);
    DeadlyImportError::DeadlyImportError(this_00,&bStack_38);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bone->parent = this;
  bone->parentId = (uint)this->id;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->children,&bone->id)
  ;
  return;
}

Assistant:

void Bone::AddChild(Bone *bone)
{
    if (!bone)
        return;
    if (bone->IsParented())
        throw DeadlyImportError("Attaching child Bone that is already parented: " + bone->name);

    bone->parent = this;
    bone->parentId = id;
    children.push_back(bone->id);
}